

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

int lj_cf_package_loader_lua(lua_State *L)

{
  int iVar1;
  lua_State *L_00;
  char *filename_00;
  lua_State *in_RDI;
  char *name;
  char *filename;
  char *in_stack_ffffffffffffffd8;
  size_t *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  L_00 = (lua_State *)
         luaL_checklstring((lua_State *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffe8);
  filename_00 = findfile(in_RDI,(char *)in_stack_ffffffffffffffe8,(char *)L_00);
  if ((filename_00 != (char *)0x0) &&
     (iVar1 = luaL_loadfile(L_00,in_stack_ffffffffffffffd8), iVar1 != 0)) {
    loaderror(in_RDI,filename_00);
  }
  return 1;
}

Assistant:

static int lj_cf_package_loader_lua(lua_State *L)
{
  const char *filename;
  const char *name = luaL_checkstring(L, 1);
  filename = findfile(L, name, "path");
  if (filename == NULL) return 1;  /* library not found in this path */
  if (luaL_loadfile(L, filename) != 0)
    loaderror(L, filename);
  return 1;  /* library loaded successfully */
}